

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O0

void __thiscall
tchecker::tck_reach::concur19::node_le_t::node_le_t(node_le_t *this,system_t *system)

{
  clock_id_t cVar1;
  clockbounds_t *__p;
  element_type *peVar2;
  map_t *pmVar3;
  system_t *system_local;
  node_le_t *this_local;
  
  __p = clockbounds::compute_clockbounds(system);
  std::shared_ptr<tchecker::clockbounds::clockbounds_t>::
  shared_ptr<tchecker::clockbounds::clockbounds_t,void>(&this->_clockbounds,__p);
  peVar2 = std::
           __shared_ptr_access<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  cVar1 = clockbounds::clockbounds_t::clocks_number(peVar2);
  pmVar3 = clockbounds::allocate_map((ulong)cVar1);
  this->_l = pmVar3;
  peVar2 = std::
           __shared_ptr_access<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  cVar1 = clockbounds::clockbounds_t::clocks_number(peVar2);
  pmVar3 = clockbounds::allocate_map((ulong)cVar1);
  this->_u = pmVar3;
  return;
}

Assistant:

node_le_t::node_le_t(tchecker::ta::system_t const & system) : _clockbounds(tchecker::clockbounds::compute_clockbounds(system))
{
  _l = tchecker::clockbounds::allocate_map(_clockbounds->clocks_number());
  _u = tchecker::clockbounds::allocate_map(_clockbounds->clocks_number());
}